

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

size_t __thiscall cnn::Parameters::size(Parameters *this)

{
  uint uVar1;
  
  uVar1 = Dim::size((Dim *)this);
  return (ulong)uVar1;
}

Assistant:

size_t Parameters::size() const { return dim.size(); }